

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * LoadImageRaw(Image *__return_storage_ptr__,char *fileName,int width,int height,int format,
                    int headerSize)

{
  uint in_EAX;
  int iVar1;
  uchar *data;
  void *__dest;
  ulong uVar2;
  int dataSize;
  undefined8 local_38;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  local_38 = (ulong)in_EAX;
  data = LoadFileData(fileName,(int *)((long)&local_38 + 4));
  if (data != (uchar *)0x0) {
    iVar1 = GetPixelDataSize(width,height,format);
    if (iVar1 <= local_38._4_4_) {
      uVar2 = (ulong)(uint)headerSize;
      if (local_38._4_4_ < iVar1 + headerSize) {
        uVar2 = 0;
      }
      if (headerSize < 1) {
        uVar2 = 0;
      }
      local_38 = CONCAT44(local_38._4_4_,format);
      __dest = malloc((long)iVar1);
      __return_storage_ptr__->data = __dest;
      memcpy(__dest,data + uVar2,(long)iVar1);
      __return_storage_ptr__->width = width;
      __return_storage_ptr__->height = height;
      __return_storage_ptr__->mipmaps = 1;
      __return_storage_ptr__->format = (int)local_38;
    }
    UnloadFileData(data);
  }
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageRaw(const char *fileName, int width, int height, int format, int headerSize)
{
    Image image = { 0 };

    int dataSize = 0;
    unsigned char *fileData = LoadFileData(fileName, &dataSize);

    if (fileData != NULL)
    {
        unsigned char *dataPtr = fileData;
        int size = GetPixelDataSize(width, height, format);

        if (size <= dataSize)   // Security check
        {
            // Offset file data to expected raw image by header size
            if ((headerSize > 0) && ((headerSize + size) <= dataSize)) dataPtr += headerSize;

            image.data = RL_MALLOC(size);      // Allocate required memory in bytes
            memcpy(image.data, dataPtr, size); // Copy required data to image
            image.width = width;
            image.height = height;
            image.mipmaps = 1;
            image.format = format;
        }

        UnloadFileData(fileData);
    }

    return image;
}